

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::SetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,LayeredTextureMap *layeredTextures,
          MeshGeometry *mesh)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"DiffuseColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_DIFFUSE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"AmbientColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_AMBIENT,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EmissiveColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_EMISSIVE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SpecularColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_SPECULAR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SpecularFactor",&local_41)
  ;
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_SPECULAR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TransparentColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_OPACITY,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ReflectionColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_REFLECTION,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"DisplacementColor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_DISPLACEMENT,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"NormalMap",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_NORMALS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Bump",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_HEIGHT,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ShininessExponent",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_SHININESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EmissiveFactor",&local_41)
  ;
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_EMISSIVE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TransparencyFactor",&local_41);
  TrySetTextureProperties(this,out_mat,layeredTextures,&local_40,aiTextureType_OPACITY,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FBXConverter::SetTextureProperties(aiMaterial* out_mat, const LayeredTextureMap& layeredTextures, const MeshGeometry* const mesh)
        {
            TrySetTextureProperties(out_mat, layeredTextures, "DiffuseColor", aiTextureType_DIFFUSE, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "AmbientColor", aiTextureType_AMBIENT, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "EmissiveColor", aiTextureType_EMISSIVE, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "SpecularColor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "SpecularFactor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "TransparentColor", aiTextureType_OPACITY, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "ReflectionColor", aiTextureType_REFLECTION, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "DisplacementColor", aiTextureType_DISPLACEMENT, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "NormalMap", aiTextureType_NORMALS, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "Bump", aiTextureType_HEIGHT, mesh);
            TrySetTextureProperties(out_mat, layeredTextures, "ShininessExponent", aiTextureType_SHININESS, mesh);
			TrySetTextureProperties( out_mat, layeredTextures, "EmissiveFactor", aiTextureType_EMISSIVE, mesh );
			TrySetTextureProperties( out_mat, layeredTextures, "TransparencyFactor", aiTextureType_OPACITY, mesh );
        }